

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int handle_streams_blocked_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  _func_void_void_ptr_char_ptr_varargs *p_Var3;
  int iVar4;
  int iVar5;
  uint64_t uVar6;
  
  uVar2 = state->frame_type;
  uVar6 = ptls_decode_quicint(&state->src,state->end);
  iVar5 = 0x20007;
  if (uVar6 < 0x1000000000000001) {
    if (quicly_trace_fp != (FILE *)0x0) {
      handle_streams_blocked_frame_cold_1();
    }
    p_Var3 = (conn->super).tracer.cb;
    if (p_Var3 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
      (*p_Var3)((conn->super).tracer.ctx,
                "{\"type\":\"streams-blocked-receive\", \"time\":%lld, \"maximum\":%llu, \"is-unidirectional\":%lld}\n"
                ,(conn->stash).now,uVar6,(ulong)(uVar2 == 0x17));
    }
    iVar4 = should_send_max_streams(conn,(uint)(uVar2 == 0x17));
    iVar5 = 0;
    if (iVar4 != 0) {
      puVar1 = (conn->egress).loss.largest_acked_packet_plus1 + (ulong)(uVar2 != 0x17) * 4 + -0xb;
      *(byte *)puVar1 = (byte)*puVar1 | 1;
      (conn->egress).send_ack_at = 0;
    }
  }
  return iVar5;
}

Assistant:

static int handle_streams_blocked_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_streams_blocked_frame_t frame;
    int uni = state->frame_type == QUICLY_FRAME_TYPE_STREAMS_BLOCKED_UNI, ret;

    if ((ret = quicly_decode_streams_blocked_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(STREAMS_BLOCKED_RECEIVE, conn, conn->stash.now, frame.count, uni);

    if (should_send_max_streams(conn, uni)) {
        quicly_maxsender_t *maxsender = uni ? &conn->ingress.max_streams.uni : &conn->ingress.max_streams.bidi;
        quicly_maxsender_request_transmit(maxsender);
        conn->egress.send_ack_at = 0;
    }

    return 0;
}